

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O3

int duckdb::History::Load(char *filename)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  size_t len;
  char *buf;
  string result;
  char *pcStack_960a0;
  idx_t iStack_96098;
  char acStack_96090 [16];
  undefined1 *puStack_96080;
  undefined8 uStack_96078;
  undefined1 auStack_96070 [16];
  LineReader LStack_96060;
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    iVar2 = -1;
  }
  else {
    pcStack_960a0 = acStack_96090;
    iStack_96098 = 0;
    acStack_96090[0] = '\0';
    while( true ) {
      bVar1 = LineReader::NextLine(&LStack_96060);
      if (!bVar1) break;
      if ((iStack_96098 == 0) && (LStack_96060.line_buffer[0] == '.')) {
        len = strlen(LStack_96060.line_buffer);
        Add(LStack_96060.line_buffer,len);
      }
      else {
        ::std::__cxx11::string::append((char *)&pcStack_960a0);
        iVar2 = duckdb_shell_sqlite3_complete(pcStack_960a0);
        if (iVar2 == 0) {
          ::std::__cxx11::string::append((char *)&pcStack_960a0);
        }
        else {
          Add(pcStack_960a0,iStack_96098);
          uStack_96078 = 0;
          auStack_96070[0] = 0;
          puStack_96080 = auStack_96070;
          ::std::__cxx11::string::operator=((string *)&pcStack_960a0,(string *)&puStack_96080);
          if (puStack_96080 != auStack_96070) {
            operator_delete(puStack_96080);
          }
        }
      }
    }
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    history_file = strdup(filename);
    if (pcStack_960a0 != acStack_96090) {
      operator_delete(pcStack_960a0);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int History::Load(const char *filename) {
	LineReader reader;
	if (!reader.Init(filename)) {
		return -1;
	}

	std::string result;
	while (reader.NextLine()) {
		auto buf = reader.GetLine();
		if (result.empty() && buf[0] == '.') {
			// if the first character is a dot this is a dot command
			// add the full line to the history
			History::Add(buf);
			continue;
		}
		// else we are parsing a SQL statement
		result += buf;
		if (sqlite3_complete(result.c_str())) {
			// this line contains a full SQL statement - add it to the history
			History::Add(result.c_str(), result.size());
			result = std::string();
			continue;
		}
		// the result does not contain a full SQL statement - add a newline deliminator and move on to the next line
		result += "\r\n";
	}
	reader.Close();

	history_file = strdup(filename);
	return 0;
}